

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool Args::details::isCorrectName(String *name)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  reference pcVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Char *c;
  const_iterator __end2;
  const_iterator __begin2;
  type *__range2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa8;
  allocator *in_stack_ffffffffffffffb0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  type *local_30;
  allocator local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  bool local_1;
  
  local_10 = in_RDI;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    if ((isCorrectName(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&isCorrectName(std::__cxx11::string_const&)::
                                     availableSymbols_abi_cxx11_), iVar2 != 0)) {
      in_stack_ffffffffffffffb0 = &local_11;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)isCorrectName(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_,
                 "0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-_",
                 in_stack_ffffffffffffffb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_11);
      __cxa_atexit(std::__cxx11::string::~string,
                   isCorrectName(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&isCorrectName(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_);
    }
    local_30 = asConst<std::__cxx11::string_const>(local_10);
    local_38._M_current = (char *)std::__cxx11::string::begin();
    std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8), bVar1) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_38);
      lVar5 = std::__cxx11::string::find('h',(ulong)(uint)(int)*pcVar4);
      if (lVar5 == -1) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_38);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline bool
isCorrectName( const String & name )
{
	if( name.empty() )
		return false;

	static const String availableSymbols( SL( "0123456789"
		"abcdefghijklmnopqrstuvwxyz"
		"ABCDEFGHIJKLMNOPQRSTUVWXYZ-_" ) );

	for( const Char & c : asConst( name ) )
	{
		if( availableSymbols.find( c ) == String::npos )
			return false;
	}

	return true;
}